

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithHistoryRecord_Test::
~SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithHistoryRecord_Test
          (SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithHistoryRecord_Test *this)

{
  StrictMock<solitaire::archivers::SnapshotMock> *pSVar1;
  
  (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.super_SolitaireTest.
  super_Test._vptr_Test = (_func_int **)&PTR__SolitaireHandWithTwoCardsTest_00323100;
  if (((this->super_SolitaireHandWithTwoCardsTest).moveOperationSnapshot.isUniquePointerCreated ==
       false) &&
     (pSVar1 = (this->super_SolitaireHandWithTwoCardsTest).moveOperationSnapshot.rawPointer,
     pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  if (((this->super_SolitaireHandWithTwoCardsTest).snapshotMock2.isUniquePointerCreated == false) &&
     (pSVar1 = (this->super_SolitaireHandWithTwoCardsTest).snapshotMock2.rawPointer,
     pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.super_SolitaireTest.
  super_Test._vptr_Test = (_func_int **)&PTR__SolitaireEmptyHandTest_00322558;
  if (((this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.snapshotMock.
       isUniquePointerCreated == false) &&
     (pSVar1 = (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.snapshotMock
               .rawPointer, pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  SolitaireTest::~SolitaireTest((SolitaireTest *)this);
  operator_delete(this,0x238);
  return;
}

Assistant:

TEST_F(SolitaireHandWithTwoCardsTest, addCardOnTableauPileWithHistoryRecord) {
    auto cardsToAdd {twoCards};

    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock2);
    expectTryingAddCardsAndClearThem(lastTableauPileMock, cardsToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2)
        .WillOnce(Return(ByMove(moveOperationSnapshot.make_unique())));
    EXPECT_CALL(*historyTrackerMock, save(Pointer(moveOperationSnapshot.get())));

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}